

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O0

ON_String __thiscall ON_ErrorEvent::ToString(ON_ErrorEvent *this)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ON_ErrorEvent *in_RSI;
  char *description;
  char *function_name;
  ON_ErrorEvent *this_local;
  
  pcVar2 = FunctionName(in_RSI);
  pcVar3 = Description(in_RSI);
  if (*pcVar2 == '\0') {
    pcVar2 = FileName(in_RSI);
    uVar1 = LineNumber(in_RSI);
    pcVar4 = TypeToString(in_RSI->m_event_type);
    ON_String::FormatToString((char *)this,"%s.%u: %s \"%s\"",pcVar2,(ulong)uVar1,pcVar4,pcVar3);
  }
  else {
    pcVar4 = FileName(in_RSI);
    uVar1 = LineNumber(in_RSI);
    pcVar5 = TypeToString(in_RSI->m_event_type);
    ON_String::FormatToString
              ((char *)this,"%s.%u %s(): %s \"%s\"",pcVar4,(ulong)uVar1,pcVar2,pcVar5,pcVar3);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_ErrorEvent::ToString() const
{
  const char* function_name = FunctionName();
  const char* description = Description();
  if (0 != function_name[0])
  {
    return ON_String::FormatToString(
      "%s.%u %s(): %s \"%s\"",
      FileName(), 
      LineNumber(), 
      function_name,
      ON_ErrorEvent::TypeToString(m_event_type),
      description
    );
  }
  return ON_String::FormatToString(
    "%s.%u: %s \"%s\"",
    FileName(), 
    LineNumber(), 
    ON_ErrorEvent::TypeToString(m_event_type),
    description
  );
}